

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_117e0d7::ExternalFrameBufferTest_EightJitterBuffers_Test::
~ExternalFrameBufferTest_EightJitterBuffers_Test
          (ExternalFrameBufferTest_EightJitterBuffers_Test *this)

{
  (this->super_ExternalFrameBufferTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ExternalFrameBufferTest_01027840;
  ExternalFrameBufferList::~ExternalFrameBufferList(&(this->super_ExternalFrameBufferTest).fb_list_)
  ;
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ExternalFrameBufferTest, EightJitterBuffers) {
  // Number of buffers equals #AOM_MAXIMUM_REF_BUFFERS +
  // #AOM_MAXIMUM_WORK_BUFFERS + eight jitter buffers.
  const int jitter_buffers = 8;
  const int num_buffers =
      AOM_MAXIMUM_REF_BUFFERS + AOM_MAXIMUM_WORK_BUFFERS + jitter_buffers;
  ASSERT_EQ(AOM_CODEC_OK,
            SetFrameBufferFunctions(num_buffers, get_aom_frame_buffer,
                                    release_aom_frame_buffer));
  ASSERT_EQ(AOM_CODEC_OK, DecodeRemainingFrames());
}